

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Token * __thiscall
toml::internal::Lexer::nextStringSingleQuote(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  TokenType type;
  char c;
  allocator local_71;
  string local_70;
  string s;
  
  bVar1 = consume(this,'\'');
  if (bVar1) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    bVar1 = current(this,&c);
    if (bVar1 && c == '\'') {
      next(this);
      bVar1 = current(this,&c);
      if (bVar1 && c == '\'') {
        next(this);
        bVar1 = current(this,&c);
        if (bVar1 && c == '\n') {
          next(this);
        }
        while( true ) {
          bVar1 = current(this,&c);
          if (!bVar1) break;
          if (c == '\'') {
            next(this);
            bVar1 = current(this,&c);
            if (bVar1 && c == '\'') {
              next(this);
              bVar1 = current(this,&c);
              if (bVar1 && c == '\'') {
                next(this);
                type = MULTILINE_STRING;
LAB_0016a092:
                Token::Token(__return_storage_ptr__,type,&s);
                goto LAB_0016a0a1;
              }
              std::__cxx11::string::push_back((char)&s);
            }
          }
          else {
            next(this);
          }
          std::__cxx11::string::push_back((char)&s);
        }
        std::__cxx11::string::string
                  ((string *)&local_70,"string didn\'t end with \'\'\'\'\' ?",&local_71);
        Token::Token(__return_storage_ptr__,ERROR_TOKEN,&local_70);
      }
      else {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        Token::Token(__return_storage_ptr__,STRING,&local_70);
      }
    }
    else {
      type = STRING;
      while( true ) {
        bVar1 = current(this,&c);
        if (!bVar1) break;
        next(this);
        if (c == '\'') goto LAB_0016a092;
        std::__cxx11::string::push_back((char)&s);
      }
      std::__cxx11::string::string((string *)&local_70,"string didn\'t end with \'\'\'?",&local_71);
      Token::Token(__return_storage_ptr__,ERROR_TOKEN,&local_70);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::string::string
              ((string *)&s,"string didn\'t start with \'\'\'?",(allocator *)&local_70);
    Token::Token(__return_storage_ptr__,ERROR_TOKEN,&s);
  }
LAB_0016a0a1:
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

inline Token Lexer::nextStringSingleQuote()
{
    if (!consume('\''))
        return Token(TokenType::ERROR_TOKEN, std::string("string didn't start with '\''?"));

    std::string s;
    char c;

    if (current(&c) && c == '\'') {
        next();
        if (!current(&c) || c != '\'') {
            // OK. It's empty string.
            return Token(TokenType::STRING, std::string());
        }
        next();
        // raw string literal started.
        // Newline just after """ should be ignored.
        if (current(&c) && c == '\n')
            next();

        while (current(&c)) {
            if (c == '\'') {
                next();
                if (current(&c) && c == '\'') {
                    next();
                    if (current(&c) && c == '\'') {
                        next();
                        return Token(TokenType::MULTILINE_STRING, s);
                    } else {
                        s += '\'';
                        s += '\'';
                        continue;
                    }
                } else {
                    s += '\'';
                    continue;
                }
            }

            next();
            s += c;
            continue;
        }

        return Token(TokenType::ERROR_TOKEN, std::string("string didn't end with '\'\'\'' ?"));
    }

    while (current(&c)) {
        next();
        if (c == '\'') {
            return Token(TokenType::STRING, s);
        }

        s += c;
    }

    return Token(TokenType::ERROR_TOKEN, std::string("string didn't end with '\''?"));
}